

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O2

bool __thiscall
JsUtil::ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer>::Contains
          (ReadOnlyList<Js::ScriptContext_*,_Memory::HeapAllocator,_DefaultComparer> *this,
          ScriptContext **item)

{
  uint uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->count;
  uVar3 = 0;
  uVar2 = 0;
  if (0 < (int)uVar1) {
    uVar3 = (ulong)uVar1;
  }
  do {
    uVar4 = uVar2;
    if (uVar3 == uVar4) break;
    uVar2 = uVar4 + 1;
  } while (*item != this->buffer[uVar4]);
  return (long)uVar4 < (long)(int)uVar1;
}

Assistant:

bool Contains(const T& item) const
        {
            for (int i = 0; i < count; i++)
            {
                if (TComparerType::Equals(item, buffer[i]))
                {
                    return true;
                }
            }
            return false;
        }